

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void feat_lda_transform(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  void *ptr;
  uint local_34;
  uint local_30;
  uint32 k;
  uint32 j;
  uint32 i;
  mfcc_t *tmp;
  uint32 nfr_local;
  mfcc_t ***inout_feat_local;
  feat_t *fcb_local;
  
  ptr = __ckd_calloc__((ulong)*fcb->stream_len,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                       ,0x91);
  for (k = 0; k < nfr; k = k + 1) {
    memset(ptr,0,(ulong)*fcb->stream_len << 2);
    for (local_30 = 0; local_30 < fcb->out_dim; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < *fcb->stream_len; local_34 = local_34 + 1) {
        *(float *)((long)ptr + (ulong)local_30 * 4) =
             (float)(*inout_feat[k])[local_34] * (float)(*fcb->lda)[local_30][local_34] +
             *(float *)((long)ptr + (ulong)local_30 * 4);
      }
    }
    memcpy(*inout_feat[k],ptr,(ulong)*fcb->stream_len << 2);
  }
  ckd_free(ptr);
  return;
}

Assistant:

void
feat_lda_transform(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    mfcc_t *tmp;
    uint32 i, j, k;

    tmp = ckd_calloc(fcb->stream_len[0], sizeof(mfcc_t));
    for (i = 0; i < nfr; ++i) {
        /* Do the matrix multiplication inline here since fcb->lda
         * is transposed (eigenvectors in rows not columns). */
        /* FIXME: In the future we ought to use the BLAS. */
        memset(tmp, 0, sizeof(mfcc_t) * fcb->stream_len[0]);
        for (j = 0; j < feat_dimension(fcb); ++j) {
            for (k = 0; k < fcb->stream_len[0]; ++k) {
                tmp[j] += MFCCMUL(inout_feat[i][0][k], fcb->lda[0][j][k]);
            }
        }
        memcpy(inout_feat[i][0], tmp, fcb->stream_len[0] * sizeof(mfcc_t));
    }
    ckd_free(tmp);
}